

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest::AddToDatabaseWithError
          (DescriptorDatabaseTest *this,char *file_descriptor_text)

{
  DescriptorDatabaseTestCase *pDVar1;
  int iVar2;
  TextFormat *this_00;
  Message *in_RCX;
  pointer *__ptr;
  char *in_R9;
  string_view input;
  AssertionResult gtest_ar_;
  FileDescriptorProto file_proto;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  AssertHelper local_148;
  internal local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  string local_130;
  FileDescriptorProto local_110;
  
  FileDescriptorProto::FileDescriptorProto(&local_110,(Arena *)0x0);
  this_00 = (TextFormat *)strlen(file_descriptor_text);
  input._M_str = (char *)&local_110;
  input._M_len = (size_t)file_descriptor_text;
  local_140[0] = (internal)TextFormat::ParseFromString(this_00,input,in_RCX);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_140[0]) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,local_140,
               (AssertionResult *)"TextFormat::ParseFromString(file_descriptor_text, &file_proto)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x8f,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,local_138);
  }
  pDVar1 = (this->test_case_)._M_t.
           super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_std::default_delete<google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase>_>
           .
           super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::DescriptorDatabaseTestCase_*,_false>
           ._M_head_impl;
  iVar2 = (*pDVar1->_vptr_DescriptorDatabaseTestCase[3])(pDVar1,&local_110);
  local_140[0] = (internal)((byte)iVar2 ^ 1);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((byte)iVar2 != 0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_130,local_140,(AssertionResult *)"test_case_->AddToDatabase(file_proto)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x90,local_130._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_138,local_138);
  }
  FileDescriptorProto::~FileDescriptorProto(&local_110);
  return;
}

Assistant:

void AddToDatabaseWithError(const char* file_descriptor_text) {
    FileDescriptorProto file_proto;
    EXPECT_TRUE(TextFormat::ParseFromString(file_descriptor_text, &file_proto));
    EXPECT_FALSE(test_case_->AddToDatabase(file_proto));
  }